

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O3

StackSym * __thiscall StackSym::CloneDef(StackSym *this,Func *func)

{
  OpCode OVar1;
  uint uVar2;
  Cloner *pCVar3;
  code *pcVar4;
  int32 iVar5;
  bool bVar6;
  SymID id;
  undefined4 *puVar7;
  StackSym **ppSVar8;
  HashTable<StackSym_*,_Memory::ArenaAllocator> *pHVar9;
  StackSym *element;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  
  pCVar3 = func->topFunc->m_cloner;
  if (pCVar3 == (Cloner *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x1d7,"(cloner)","Use Func::BeginClone to initialize cloner");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  if ((this->field_0x18 & 1) != 0) {
    OVar1 = ((this->field_5).m_instrDef)->m_opcode;
    if (OVar1 < ArgOut_A_InlineBuiltIn) {
      if ((OVar1 != StartCall) && (OVar1 != ArgOut_A)) {
        return this;
      }
    }
    else if (((5 < OVar1 - 0x1ee) || ((0x25U >> (OVar1 - 0x1ee & 0x1f) & 1) == 0)) &&
            (OVar1 != InlineeMetaArg)) {
      return this;
    }
    if (pCVar3->symMap == (HashTable<StackSym_*,_Memory::ArenaAllocator> *)0x0) {
      pHVar9 = HashTable<StackSym_*,_Memory::ArenaAllocator>::New
                         (&pCVar3->alloc->super_ArenaAllocator,7);
      pCVar3->symMap = pHVar9;
    }
    else {
      ppSVar8 = HashTable<StackSym_*,_Memory::ArenaAllocator>::Get
                          (pCVar3->symMap,(this->super_Sym).m_id);
      if ((ppSVar8 != (StackSym **)0x0) && (*ppSVar8 != (StackSym *)0x0)) {
        return *ppSVar8;
      }
    }
    id = SymTable::NewID(func->m_symTable);
    element = New(id,TyVar,0xffffffff,func);
    uVar10 = *(uint *)&this->field_0x18 & 8;
    uVar2 = *(uint *)&element->field_0x18;
    *(uint *)&element->field_0x18 = uVar2 & 0xfffffff7 | uVar10;
    uVar11 = *(uint *)&this->field_0x18 & 0x10;
    *(uint *)&element->field_0x18 = uVar2 & 0xffffffe7 | uVar10 | uVar11;
    uVar12 = *(uint *)&this->field_0x18 & 0x20;
    *(uint *)&element->field_0x18 = uVar2 & 0xffffffc7 | uVar10 | uVar11 | uVar12;
    uVar13 = *(uint *)&this->field_0x18 & 0x100000;
    *(uint *)&element->field_0x18 = uVar2 & 0xffefffc7 | uVar10 | uVar11 | uVar12 | uVar13;
    uVar14 = *(uint *)&this->field_0x18 & 0x200000;
    *(uint *)&element->field_0x18 = uVar2 & 0xffcfffc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14;
    uVar15 = *(uint *)&this->field_0x18 & 0x400000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xff8fffc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
    uVar16 = *(uint *)&this->field_0x18 & 0x800000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xff0fffc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16;
    uVar17 = *(uint *)&this->field_0x18 & 0x2000000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xfd0fffc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17;
    uVar18 = *(uint *)&this->field_0x18 & 0x1000000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xfc0fffc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18;
    *(undefined2 *)&(element->super_Sym).field_0x16 = *(undefined2 *)&(this->super_Sym).field_0x16;
    iVar5 = this->m_argPosition;
    element->m_offset = this->m_offset;
    element->m_argPosition = iVar5;
    uVar19 = *(uint *)&this->field_0x18 & 0x1000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xfc0fefc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18 | uVar19;
    uVar20 = *(uint *)&this->field_0x18 & 0x4000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xfc0fafc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18 | uVar19 | uVar20;
    uVar21 = *(uint *)&this->field_0x18 & 0x8000000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xf40fafc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18 | uVar19 | uVar20 | uVar21;
    uVar22 = *(uint *)&this->field_0x18 & 0x10000000;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xe40fafc7 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18 | uVar19 | uVar20 | uVar21 | uVar22;
    element->m_type = this->m_type;
    uVar23 = *(uint *)&this->field_0x18 & 2;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xe40fafc5 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18 | uVar19 | uVar20 | uVar21 | uVar22 | uVar23;
    *(uint *)&element->field_0x18 =
         uVar2 & 0xe40fafc1 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15 | uVar16 | uVar17
         | uVar18 | uVar19 | uVar20 | uVar21 | uVar22 | uVar23 | *(uint *)&this->field_0x18 & 4;
    (element->m_builtInIndex)._value = (this->m_builtInIndex)._value;
    element->m_equivNext = element;
    HashTable<StackSym_*,_Memory::ArenaAllocator>::FindOrInsert
              (pCVar3->symMap,element,(this->super_Sym).m_id);
    this = element;
  }
  return this;
}

Assistant:

StackSym *
StackSym::CloneDef(Func *func)
{
    Cloner * cloner = func->GetCloner();
    StackSym *  newSym = nullptr;

    AssertMsg(cloner, "Use Func::BeginClone to initialize cloner");

    if (!this->m_isSingleDef)
    {
        return this;
    }

    switch (this->m_instrDef->m_opcode)
    {
        // Note: we were cloning single-def load constant instr's, but couldn't guarantee
        // that we were cloning all the uses.
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_SpreadArg:
    case Js::OpCode::StartCall:
    case Js::OpCode::InlineeMetaArg:
        // Go ahead and clone: we need a single-def sym.
        // Arg/StartCall trees must be single-def.
        // Uses of int-const syms may need to find their defining instr's.
        break;
    default:
        return this;
    }

    if (cloner->symMap == nullptr)
    {
        cloner->symMap = HashTable<StackSym*>::New(cloner->alloc, 7);
    }
    else
    {
        StackSym **entry = cloner->symMap->Get(m_id);
        if (entry)
        {
            newSym = *entry;
        }
    }
    if (newSym == nullptr)
    {
        // NOTE: We don't care about the bytecode register information for cloned symbol
        // As those are the float sym that we will convert back to Var before jumping back
        // to the slow path's bailout.  The bailout can just track the original symbol.
        newSym = StackSym::New(func);
        newSym->m_isConst = m_isConst;
        newSym->m_isIntConst = m_isIntConst;
        newSym->m_isTaggableIntConst = m_isTaggableIntConst;
        newSym->m_isArgSlotSym = m_isArgSlotSym;
        newSym->m_isArgSlotRegSym = m_isArgSlotRegSym;
        newSym->m_isParamSym = m_isParamSym;
        newSym->m_isImplicitParamSym = m_isImplicitParamSym;
        newSym->m_isArgCaptured = m_isArgCaptured;
        newSym->m_isBailOutReferenced = m_isBailOutReferenced;
        newSym->m_slotNum = m_slotNum;

#if defined(_M_X64)
        newSym->m_argPosition = m_argPosition;
#endif

        newSym->m_offset = m_offset;
        newSym->m_allocated = m_allocated;
        newSym->m_isInlinedArgSlot = m_isInlinedArgSlot;
        newSym->m_isCatchObjectSym = m_isCatchObjectSym;
        newSym->m_isClosureSym = m_isClosureSym;
        newSym->m_type = m_type;

        newSym->CopySymAttrs(this);

        // NOTE: It is not clear what the right thing to do is here...
        newSym->m_equivNext = newSym;
        cloner->symMap->FindOrInsert(newSym, m_id);
    }

    return newSym;
}